

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

int htmlSaveFile(char *filename,xmlDocPtr cur)

{
  xmlParserErrors xVar1;
  xmlChar *encoding_00;
  int ret;
  char *encoding;
  xmlCharEncodingHandlerPtr handler;
  xmlOutputBufferPtr buf;
  xmlDocPtr cur_local;
  char *filename_local;
  
  encoding = (char *)0x0;
  if ((cur == (xmlDocPtr)0x0) || (filename == (char *)0x0)) {
    filename_local._4_4_ = -1;
  }
  else {
    buf = (xmlOutputBufferPtr)cur;
    cur_local = (xmlDocPtr)filename;
    xmlInitParser();
    encoding_00 = htmlGetMetaEncoding((htmlDocPtr)buf);
    xVar1 = htmlFindOutputEncoder((char *)encoding_00,(xmlCharEncodingHandler **)&encoding);
    if (xVar1 == XML_ERR_OK) {
      handler = (xmlCharEncodingHandlerPtr)
                xmlOutputBufferCreateFilename
                          ((char *)cur_local,(xmlCharEncodingHandlerPtr)encoding,
                           *(int *)&buf[1].closecallback);
      if ((xmlOutputBufferPtr)handler == (xmlOutputBufferPtr)0x0) {
        filename_local._4_4_ = -1;
      }
      else {
        htmlDocContentDumpOutput((xmlOutputBufferPtr)handler,(xmlDocPtr)buf,(char *)0x0);
        filename_local._4_4_ = xmlOutputBufferClose((xmlOutputBufferPtr)handler);
      }
    }
    else {
      filename_local._4_4_ = -1;
    }
  }
  return filename_local._4_4_;
}

Assistant:

int
htmlSaveFile(const char *filename, xmlDocPtr cur) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    const char *encoding;
    int ret;

    if ((cur == NULL) || (filename == NULL))
        return(-1);

    xmlInitParser();

    encoding = (const char *) htmlGetMetaEncoding(cur);
    if (htmlFindOutputEncoder(encoding, &handler) != XML_ERR_OK)
        return(-1);
    buf = xmlOutputBufferCreateFilename(filename, handler, cur->compression);
    if (buf == NULL)
        return(-1);

    htmlDocContentDumpOutput(buf, cur, NULL);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}